

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  int *piVar1;
  void **ppvVar2;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  Mat weight_data_int8_scales_g;
  Mat int8_weight_data_g;
  Mat weight_data_g;
  Option opt_q;
  int g;
  int weight_data_size_g;
  Mat int8_weight_data;
  float top_blob_int8_scale;
  float bottom_blob_int8_scale_1;
  float weight_data_int8_scale;
  float bottom_blob_int8_scale;
  int i_3;
  float *ptr_3;
  int size_3;
  int i_2;
  float *ptr_2;
  int size_2;
  int i_1;
  float *ptr_1;
  int size_1;
  int i;
  float *ptr;
  int size;
  Option *in_stack_fffffffffffff020;
  Allocator *in_stack_fffffffffffff028;
  size_t in_stack_fffffffffffff030;
  void **ppvVar4;
  int in_stack_fffffffffffff03c;
  Mat *in_stack_fffffffffffff040;
  bool local_f61;
  Mat *in_stack_fffffffffffff128;
  Mat *in_stack_fffffffffffff130;
  Mat *in_stack_fffffffffffff138;
  Mat *in_stack_fffffffffffff140;
  Mat *pMVar5;
  void *local_db8;
  int *local_db0;
  undefined8 local_da8;
  undefined4 local_da0;
  long *local_d98;
  undefined4 local_d90;
  undefined4 local_d8c;
  undefined4 local_d88;
  undefined4 local_d84;
  undefined4 local_d80;
  undefined8 local_d78;
  void *local_d70;
  int *local_d68;
  long local_d60;
  undefined4 local_d58;
  long *local_d50;
  undefined4 local_d48;
  int local_d44;
  undefined4 local_d40;
  undefined4 local_d3c;
  undefined4 local_d38;
  long local_d30;
  void *local_d28;
  int *local_d20;
  undefined8 local_d18;
  undefined4 local_d10;
  long *local_d08;
  undefined4 local_d00;
  int local_cfc;
  undefined4 local_cf8;
  undefined4 local_cf4;
  undefined4 local_cf0;
  long local_ce8;
  undefined4 local_cdc;
  long *local_cd8;
  undefined1 local_cb9;
  int local_c9c;
  int local_c98;
  int local_c94;
  void *local_c90;
  int *local_c88;
  long local_c80;
  undefined4 local_c78;
  long *local_c70;
  undefined4 local_c68;
  undefined4 local_c64;
  undefined4 local_c60;
  undefined4 local_c5c;
  int local_c58;
  long local_c50;
  void *local_c48;
  int *local_c40;
  undefined8 local_c38;
  undefined4 local_c30;
  long *local_c28;
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  undefined8 local_c08;
  undefined4 local_bfc;
  void *local_bf8;
  int *local_bf0;
  undefined8 local_be8;
  undefined4 local_be0;
  long *local_bd8;
  undefined4 local_bd0;
  undefined4 local_bcc;
  undefined4 local_bc8;
  undefined4 local_bc4;
  undefined4 local_bc0;
  undefined8 local_bb8;
  void *local_bb0;
  int *local_ba8;
  undefined8 local_ba0;
  undefined4 local_b98;
  long *local_b90;
  undefined4 local_b88;
  undefined4 local_b84;
  undefined4 local_b80;
  undefined4 local_b7c;
  undefined4 local_b78;
  undefined8 local_b70;
  undefined4 local_b64;
  Mat local_b60;
  undefined4 local_b14;
  void *local_b10;
  int *local_b08;
  undefined8 local_b00;
  undefined4 local_af8;
  long *local_af0;
  undefined4 local_ae8;
  undefined4 local_ae4;
  undefined4 local_ae0;
  undefined4 local_adc;
  undefined4 local_ad8;
  undefined8 local_ad0;
  void *local_ac8;
  int *local_ac0;
  undefined8 local_ab8;
  undefined4 local_ab0;
  long *local_aa8;
  undefined4 local_aa0;
  undefined4 local_a9c;
  undefined4 local_a98;
  undefined4 local_a94;
  undefined4 local_a90;
  undefined8 local_a88;
  void *local_a80;
  int *local_a78;
  undefined8 local_a70;
  undefined4 local_a68;
  long *local_a60;
  undefined4 local_a58;
  undefined4 local_a54;
  undefined4 local_a50;
  undefined4 local_a4c;
  undefined4 local_a48;
  undefined8 local_a40;
  undefined4 local_a34;
  void *local_a30;
  int *local_a28;
  undefined8 local_a20;
  undefined4 local_a18;
  long *local_a10;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined8 local_9f0;
  void *local_9e8;
  int *local_9e0;
  undefined8 local_9d8;
  undefined4 local_9d0;
  long *local_9c8;
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  undefined4 local_9b0;
  undefined8 local_9a8;
  void *local_9a0;
  int *local_998;
  undefined8 local_990;
  undefined4 local_988;
  long *local_980;
  undefined4 local_978;
  undefined4 local_974;
  undefined4 local_970;
  undefined4 local_96c;
  undefined4 local_968;
  undefined8 local_960;
  void *local_948;
  int *local_940;
  undefined8 local_938;
  undefined4 local_930;
  long *local_928;
  undefined4 local_920;
  undefined4 local_91c;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  undefined8 local_908;
  long *local_900;
  int local_8ec;
  void **local_8e8;
  void **local_8d8;
  void **local_8c8;
  void **local_8b8;
  void **local_8a8;
  void **local_898;
  void **local_888;
  Mat *local_878;
  void **local_868;
  void **local_858;
  void **local_848;
  void **local_838;
  void **local_828;
  void **local_818;
  void **local_808;
  int local_7f8;
  undefined4 local_7f4;
  void **local_7f0;
  void **local_7e8;
  void **local_7e0;
  int local_7d8;
  undefined4 local_7d4;
  void **local_7d0;
  void **local_7c8;
  void **local_7c0;
  int local_7b8;
  undefined4 local_7b4;
  void **local_7b0;
  void **local_7a8;
  void **local_7a0;
  int local_798;
  undefined4 local_794;
  void **local_790;
  void **local_788;
  void **local_780;
  int local_778;
  undefined4 local_774;
  Mat *local_770;
  Mat *local_768;
  Mat *local_760;
  int local_758;
  undefined4 local_754;
  void **local_750;
  void **local_748;
  void **local_740;
  int local_738;
  undefined4 local_734;
  void **local_730;
  void **local_728;
  void **local_720;
  int local_718;
  undefined4 local_714;
  void **local_710;
  void **local_708;
  void **local_700;
  int local_6f8;
  undefined4 local_6f4;
  void **local_6f0;
  void **local_6e8;
  void **local_6e0;
  int local_6d8;
  undefined4 local_6d4;
  void **local_6d0;
  void **local_6c8;
  void **local_6c0;
  int local_6b8;
  undefined4 local_6b4;
  void **local_6b0;
  void **local_6a8;
  void **local_6a0;
  int local_698;
  undefined4 local_694;
  void **local_690;
  void **local_688;
  void **local_680;
  void **local_678;
  long *local_670;
  long *local_668;
  undefined8 local_660;
  undefined8 *local_658;
  undefined8 local_650;
  undefined8 *local_648;
  undefined8 local_640;
  undefined8 *local_638;
  undefined8 local_630;
  undefined8 *local_628;
  undefined8 local_620;
  undefined8 local_618;
  undefined4 local_60c;
  void **local_608;
  undefined8 local_600;
  undefined8 local_5f8;
  undefined4 local_5ec;
  Mat *local_5e8;
  undefined8 local_5e0;
  undefined8 local_5d8;
  undefined4 local_5cc;
  void **local_5c8;
  undefined8 local_5c0;
  undefined8 local_5b8;
  undefined4 local_5ac;
  void **local_5a8;
  undefined8 local_5a0;
  undefined8 local_598;
  undefined4 local_58c;
  void **local_588;
  int local_57c;
  undefined4 *local_578;
  int local_570;
  undefined4 local_56c;
  undefined8 *local_568;
  int local_55c;
  undefined4 *local_558;
  int local_550;
  undefined4 local_54c;
  undefined8 *local_548;
  int local_53c;
  undefined4 *local_538;
  int local_530;
  undefined4 local_52c;
  undefined8 *local_528;
  int local_51c;
  undefined4 *local_518;
  int local_510;
  undefined4 local_50c;
  undefined8 *local_508;
  undefined4 local_500;
  int local_4fc;
  long *local_4f8;
  void **local_4f0;
  int local_4e8;
  int local_4e4;
  void **local_4e0;
  void **local_4d8;
  int local_4d0;
  int local_4cc;
  long *local_4c8;
  void **local_4c0;
  int local_4b8;
  undefined4 local_4b4;
  void **local_4b0;
  int local_4a8;
  undefined4 local_4a4;
  void **local_4a0;
  int local_498;
  undefined4 local_494;
  void **local_490;
  int local_488;
  undefined4 local_484;
  void **local_480;
  int local_478;
  undefined4 local_474;
  void **local_470;
  int local_468;
  undefined4 local_464;
  void **local_460;
  int local_458;
  undefined4 local_454;
  void **local_450;
  int local_448;
  undefined4 local_444;
  Mat *local_440;
  int local_438;
  undefined4 local_434;
  void **local_430;
  int local_428;
  undefined4 local_424;
  void **local_420;
  int local_418;
  undefined4 local_414;
  void **local_410;
  int local_408;
  undefined4 local_404;
  void **local_400;
  int local_3e8;
  undefined4 local_3e4;
  void **local_3e0;
  int local_3c8;
  undefined4 local_3c4;
  void **local_3c0;
  int local_3a8;
  undefined4 local_3a4;
  void **local_3a0;
  int local_388;
  undefined4 local_384;
  void **local_380;
  int local_368;
  undefined4 local_364;
  void **local_360;
  int local_348;
  undefined4 local_344;
  void **local_340;
  int local_328;
  undefined4 local_324;
  void **local_320;
  int local_308;
  undefined4 local_304;
  Mat *local_300;
  int local_2e8;
  undefined4 local_2e4;
  void **local_2e0;
  int local_2c8;
  undefined4 local_2c4;
  void **local_2c0;
  int local_2a8;
  undefined4 local_2a4;
  void **local_2a0;
  int local_288;
  undefined4 local_284;
  void **local_280;
  int local_268;
  undefined4 local_264;
  void **local_260;
  int local_248;
  undefined4 local_244;
  void **local_240;
  int local_228;
  undefined4 local_224;
  void **local_220;
  void *local_1d8;
  void *local_1a8;
  void *local_198;
  void *local_178;
  void *local_168;
  void *local_158;
  void *local_148;
  void *local_138;
  void *local_128;
  void *local_120;
  void *local_118;
  void *local_110;
  void *local_108;
  void *local_100;
  void *local_f8;
  void *local_f0;
  void *local_e8;
  void *local_e0;
  void *local_d8;
  void *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  long *local_a8;
  long *local_a0;
  void **local_98;
  long *local_90;
  undefined4 local_84;
  undefined8 local_80;
  void *local_78;
  int local_6c;
  void **local_68;
  undefined4 local_54;
  long local_50;
  void *local_48;
  int local_3c;
  void **local_38;
  long *local_30;
  undefined4 local_24;
  undefined8 local_20;
  void *local_18;
  undefined4 local_c;
  void **local_8;
  
  if (*(int *)(in_RDI + 0x160) == 0) {
    local_900 = in_RSI;
    (**(code **)(*in_RSI + 0x10))(&local_948,in_RSI,*(undefined4 *)(in_RDI + 0x104),0);
    ppvVar2 = (void **)(in_RDI + 0x168);
    local_690 = &local_948;
    local_688 = ppvVar2;
    if (ppvVar2 != local_690) {
      if (local_940 != (int *)0x0) {
        local_694 = 1;
        LOCK();
        local_698 = *local_940;
        *local_940 = *local_940 + 1;
        UNLOCK();
      }
      local_4b0 = ppvVar2;
      if (*(long *)(in_RDI + 0x170) != 0) {
        piVar1 = *(int **)(in_RDI + 0x170);
        local_4b4 = 0xffffffff;
        LOCK();
        local_4b8 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_4b8 == 1) {
          if (*(long *)(in_RDI + 0x188) == 0) {
            local_d0 = *ppvVar2;
            if (local_d0 != (void *)0x0) {
              free(local_d0);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x188) + 0x18))(*(long **)(in_RDI + 0x188),*ppvVar2);
          }
        }
      }
      *ppvVar2 = (void *)0x0;
      *(undefined8 *)(in_RDI + 0x178) = 0;
      *(undefined4 *)(in_RDI + 0x180) = 0;
      *(undefined4 *)(in_RDI + 400) = 0;
      *(undefined4 *)(in_RDI + 0x194) = 0;
      *(undefined4 *)(in_RDI + 0x198) = 0;
      *(undefined4 *)(in_RDI + 0x19c) = 0;
      *(undefined4 *)(in_RDI + 0x1a0) = 0;
      *(undefined8 *)(in_RDI + 0x1a8) = 0;
      *(undefined8 *)(in_RDI + 0x170) = 0;
      *ppvVar2 = *local_690;
      *(void **)(in_RDI + 0x170) = local_690[1];
      *(void **)(in_RDI + 0x178) = local_690[2];
      *(undefined4 *)(in_RDI + 0x180) = *(undefined4 *)(local_690 + 3);
      *(void **)(in_RDI + 0x188) = local_690[4];
      *(undefined4 *)(in_RDI + 400) = *(undefined4 *)(local_690 + 5);
      *(undefined4 *)(in_RDI + 0x194) = *(undefined4 *)((long)local_690 + 0x2c);
      *(undefined4 *)(in_RDI + 0x198) = *(undefined4 *)(local_690 + 6);
      *(undefined4 *)(in_RDI + 0x19c) = *(undefined4 *)((long)local_690 + 0x34);
      *(undefined4 *)(in_RDI + 0x1a0) = *(undefined4 *)(local_690 + 7);
      *(void **)(in_RDI + 0x1a8) = local_690[8];
    }
    local_8e8 = &local_948;
    local_680 = ppvVar2;
    local_220 = local_8e8;
    if (local_940 != (int *)0x0) {
      local_224 = 0xffffffff;
      LOCK();
      local_228 = *local_940;
      *local_940 = *local_940 + -1;
      UNLOCK();
      if (local_228 == 1) {
        if (local_928 == (long *)0x0) {
          if (local_948 != (void *)0x0) {
            free(local_948);
          }
        }
        else {
          (**(code **)(*local_928 + 0x18))(local_928,local_948);
        }
      }
    }
    local_948 = (void *)0x0;
    local_938 = 0;
    local_930 = 0;
    local_920 = 0;
    local_91c = 0;
    local_918 = 0;
    local_914 = 0;
    local_910 = 0;
    local_908 = 0;
    local_940 = (int *)0x0;
    local_668 = (long *)(in_RDI + 0x168);
    bVar3 = true;
    if (*local_668 != 0) {
      bVar3 = *(long *)(in_RDI + 0x1a8) * (long)*(int *)(in_RDI + 0x1a0) == 0;
      local_a8 = local_668;
    }
    if (bVar3) {
      local_8ec = -100;
    }
    else {
      if (*(int *)(in_RDI + 0x100) != 0) {
        (**(code **)(*local_900 + 0x10))(&local_9a0,local_900,*(undefined4 *)(in_RDI + 0xd0),1);
        ppvVar2 = (void **)(in_RDI + 0x1b0);
        local_6b0 = &local_9a0;
        local_6a8 = ppvVar2;
        if (ppvVar2 != local_6b0) {
          if (local_998 != (int *)0x0) {
            local_6b4 = 1;
            LOCK();
            local_6b8 = *local_998;
            *local_998 = *local_998 + 1;
            UNLOCK();
          }
          local_4a0 = ppvVar2;
          if (*(long *)(in_RDI + 0x1b8) != 0) {
            piVar1 = *(int **)(in_RDI + 0x1b8);
            local_4a4 = 0xffffffff;
            LOCK();
            local_4a8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_4a8 == 1) {
              if (*(long *)(in_RDI + 0x1d0) == 0) {
                local_d8 = *ppvVar2;
                if (local_d8 != (void *)0x0) {
                  free(local_d8);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x1d0) + 0x18))
                          (*(long **)(in_RDI + 0x1d0),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x1c0) = 0;
          *(undefined4 *)(in_RDI + 0x1c8) = 0;
          *(undefined4 *)(in_RDI + 0x1d8) = 0;
          *(undefined4 *)(in_RDI + 0x1dc) = 0;
          *(undefined4 *)(in_RDI + 0x1e0) = 0;
          *(undefined4 *)(in_RDI + 0x1e4) = 0;
          *(undefined4 *)(in_RDI + 0x1e8) = 0;
          *(undefined8 *)(in_RDI + 0x1f0) = 0;
          *(undefined8 *)(in_RDI + 0x1b8) = 0;
          *ppvVar2 = *local_6b0;
          *(void **)(in_RDI + 0x1b8) = local_6b0[1];
          *(void **)(in_RDI + 0x1c0) = local_6b0[2];
          *(undefined4 *)(in_RDI + 0x1c8) = *(undefined4 *)(local_6b0 + 3);
          *(void **)(in_RDI + 0x1d0) = local_6b0[4];
          *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_6b0 + 5);
          *(undefined4 *)(in_RDI + 0x1dc) = *(undefined4 *)((long)local_6b0 + 0x2c);
          *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_6b0 + 6);
          *(undefined4 *)(in_RDI + 0x1e4) = *(undefined4 *)((long)local_6b0 + 0x34);
          *(undefined4 *)(in_RDI + 0x1e8) = *(undefined4 *)(local_6b0 + 7);
          *(void **)(in_RDI + 0x1f0) = local_6b0[8];
        }
        local_8d8 = &local_9a0;
        local_6a0 = ppvVar2;
        local_240 = local_8d8;
        if (local_998 != (int *)0x0) {
          local_244 = 0xffffffff;
          LOCK();
          local_248 = *local_998;
          *local_998 = *local_998 + -1;
          UNLOCK();
          if (local_248 == 1) {
            if (local_980 == (long *)0x0) {
              if (local_9a0 != (void *)0x0) {
                free(local_9a0);
              }
            }
            else {
              (**(code **)(*local_980 + 0x18))(local_980,local_9a0);
            }
          }
        }
        local_9a0 = (void *)0x0;
        local_990 = 0;
        local_988 = 0;
        local_978 = 0;
        local_974 = 0;
        local_970 = 0;
        local_96c = 0;
        local_968 = 0;
        local_960 = 0;
        local_998 = (int *)0x0;
        local_670 = (long *)(in_RDI + 0x1b0);
        bVar3 = true;
        if (*local_670 != 0) {
          bVar3 = *(long *)(in_RDI + 0x1f0) * (long)*(int *)(in_RDI + 0x1e8) == 0;
          local_a0 = local_670;
        }
        if (bVar3) {
          return -100;
        }
      }
      if ((*(int *)(in_RDI + 0x10c) == 1) || (*(int *)(in_RDI + 0x10c) == 0x65)) {
        (**(code **)(*local_900 + 0x10))(&local_9e8,local_900,*(undefined4 *)(in_RDI + 0x108),1);
        ppvVar2 = (void **)(in_RDI + 0x1f8);
        local_6d0 = &local_9e8;
        local_6c8 = ppvVar2;
        if (ppvVar2 != local_6d0) {
          if (local_9e0 != (int *)0x0) {
            local_6d4 = 1;
            LOCK();
            local_6d8 = *local_9e0;
            *local_9e0 = *local_9e0 + 1;
            UNLOCK();
          }
          local_490 = ppvVar2;
          if (*(long *)(in_RDI + 0x200) != 0) {
            piVar1 = *(int **)(in_RDI + 0x200);
            local_494 = 0xffffffff;
            LOCK();
            local_498 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_498 == 1) {
              if (*(long *)(in_RDI + 0x218) == 0) {
                local_e0 = *ppvVar2;
                if (local_e0 != (void *)0x0) {
                  free(local_e0);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x218) + 0x18))
                          (*(long **)(in_RDI + 0x218),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x208) = 0;
          *(undefined4 *)(in_RDI + 0x210) = 0;
          *(undefined4 *)(in_RDI + 0x220) = 0;
          *(undefined4 *)(in_RDI + 0x224) = 0;
          *(undefined4 *)(in_RDI + 0x228) = 0;
          *(undefined4 *)(in_RDI + 0x22c) = 0;
          *(undefined4 *)(in_RDI + 0x230) = 0;
          *(undefined8 *)(in_RDI + 0x238) = 0;
          *(undefined8 *)(in_RDI + 0x200) = 0;
          *ppvVar2 = *local_6d0;
          *(void **)(in_RDI + 0x200) = local_6d0[1];
          *(void **)(in_RDI + 0x208) = local_6d0[2];
          *(undefined4 *)(in_RDI + 0x210) = *(undefined4 *)(local_6d0 + 3);
          *(void **)(in_RDI + 0x218) = local_6d0[4];
          *(undefined4 *)(in_RDI + 0x220) = *(undefined4 *)(local_6d0 + 5);
          *(undefined4 *)(in_RDI + 0x224) = *(undefined4 *)((long)local_6d0 + 0x2c);
          *(undefined4 *)(in_RDI + 0x228) = *(undefined4 *)(local_6d0 + 6);
          *(undefined4 *)(in_RDI + 0x22c) = *(undefined4 *)((long)local_6d0 + 0x34);
          *(undefined4 *)(in_RDI + 0x230) = *(undefined4 *)(local_6d0 + 7);
          *(void **)(in_RDI + 0x238) = local_6d0[8];
        }
        local_8c8 = &local_9e8;
        local_6c0 = ppvVar2;
        local_260 = local_8c8;
        if (local_9e0 != (int *)0x0) {
          local_264 = 0xffffffff;
          LOCK();
          local_268 = *local_9e0;
          *local_9e0 = *local_9e0 + -1;
          UNLOCK();
          if (local_268 == 1) {
            if (local_9c8 == (long *)0x0) {
              if (local_9e8 != (void *)0x0) {
                free(local_9e8);
              }
            }
            else {
              (**(code **)(*local_9c8 + 0x18))(local_9c8,local_9e8);
            }
          }
        }
        local_9e8 = (void *)0x0;
        local_9d8 = 0;
        local_9d0 = 0;
        local_9c0 = 0;
        local_9bc = 0;
        local_9b8 = 0;
        local_9b4 = 0;
        local_9b0 = 0;
        local_9a8 = 0;
        local_9e0 = (int *)0x0;
        (**(code **)(*local_900 + 0x10))(&local_a30,local_900,1);
        ppvVar2 = (void **)(in_RDI + 0x240);
        local_6f0 = &local_a30;
        local_6e8 = ppvVar2;
        if (ppvVar2 != local_6f0) {
          if (local_a28 != (int *)0x0) {
            local_6f4 = 1;
            LOCK();
            local_6f8 = *local_a28;
            *local_a28 = *local_a28 + 1;
            UNLOCK();
          }
          local_480 = ppvVar2;
          if (*(long *)(in_RDI + 0x248) != 0) {
            piVar1 = *(int **)(in_RDI + 0x248);
            local_484 = 0xffffffff;
            LOCK();
            local_488 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_488 == 1) {
              if (*(long *)(in_RDI + 0x260) == 0) {
                local_e8 = *ppvVar2;
                if (local_e8 != (void *)0x0) {
                  free(local_e8);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x260) + 0x18))
                          (*(long **)(in_RDI + 0x260),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x250) = 0;
          *(undefined4 *)(in_RDI + 600) = 0;
          *(undefined4 *)(in_RDI + 0x268) = 0;
          *(undefined4 *)(in_RDI + 0x26c) = 0;
          *(undefined4 *)(in_RDI + 0x270) = 0;
          *(undefined4 *)(in_RDI + 0x274) = 0;
          *(undefined4 *)(in_RDI + 0x278) = 0;
          *(undefined8 *)(in_RDI + 0x280) = 0;
          *(undefined8 *)(in_RDI + 0x248) = 0;
          *ppvVar2 = *local_6f0;
          *(void **)(in_RDI + 0x248) = local_6f0[1];
          *(void **)(in_RDI + 0x250) = local_6f0[2];
          *(undefined4 *)(in_RDI + 600) = *(undefined4 *)(local_6f0 + 3);
          *(void **)(in_RDI + 0x260) = local_6f0[4];
          *(undefined4 *)(in_RDI + 0x268) = *(undefined4 *)(local_6f0 + 5);
          *(undefined4 *)(in_RDI + 0x26c) = *(undefined4 *)((long)local_6f0 + 0x2c);
          *(undefined4 *)(in_RDI + 0x270) = *(undefined4 *)(local_6f0 + 6);
          *(undefined4 *)(in_RDI + 0x274) = *(undefined4 *)((long)local_6f0 + 0x34);
          *(undefined4 *)(in_RDI + 0x278) = *(undefined4 *)(local_6f0 + 7);
          *(void **)(in_RDI + 0x280) = local_6f0[8];
        }
        local_8b8 = &local_a30;
        local_6e0 = ppvVar2;
        local_280 = local_8b8;
        if (local_a28 != (int *)0x0) {
          local_284 = 0xffffffff;
          LOCK();
          local_288 = *local_a28;
          *local_a28 = *local_a28 + -1;
          UNLOCK();
          if (local_288 == 1) {
            if (local_a10 == (long *)0x0) {
              if (local_a30 != (void *)0x0) {
                free(local_a30);
              }
            }
            else {
              (**(code **)(*local_a10 + 0x18))(local_a10,local_a30);
            }
          }
        }
        local_a30 = (void *)0x0;
        local_a20 = 0;
        local_a18 = 0;
        local_a08 = 0;
        local_a04 = 0;
        local_a00 = 0;
        local_9fc = 0;
        local_9f8 = 0;
        local_9f0 = 0;
        local_a28 = (int *)0x0;
        local_628 = (undefined8 *)(in_RDI + 0x240);
        local_630 = 0;
        local_a34 = *(undefined4 *)*local_628;
        local_60c = *(undefined4 *)(in_RDI + 0x108);
        local_608 = &local_a80;
        local_618 = 4;
        local_620 = 0;
        local_a80 = (void *)0x0;
        local_a78 = (int *)0x0;
        local_a70 = 0;
        local_a68 = 0;
        local_a60 = (long *)0x0;
        local_a58 = 0;
        local_a54 = 0;
        local_a50 = 0;
        local_a4c = 0;
        local_a48 = 0;
        local_a40 = 0;
        Mat::create(in_stack_fffffffffffff040,in_stack_fffffffffffff03c,in_stack_fffffffffffff030,
                    in_stack_fffffffffffff028);
        ppvVar2 = (void **)(in_RDI + 0x240);
        local_710 = &local_a80;
        local_708 = ppvVar2;
        if (ppvVar2 != local_710) {
          if (local_a78 != (int *)0x0) {
            local_714 = 1;
            LOCK();
            local_718 = *local_a78;
            *local_a78 = *local_a78 + 1;
            UNLOCK();
          }
          local_470 = ppvVar2;
          if (*(long *)(in_RDI + 0x248) != 0) {
            piVar1 = *(int **)(in_RDI + 0x248);
            local_474 = 0xffffffff;
            LOCK();
            local_478 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_478 == 1) {
              if (*(long *)(in_RDI + 0x260) == 0) {
                local_f0 = *ppvVar2;
                if (local_f0 != (void *)0x0) {
                  free(local_f0);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x260) + 0x18))
                          (*(long **)(in_RDI + 0x260),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x250) = 0;
          *(undefined4 *)(in_RDI + 600) = 0;
          *(undefined4 *)(in_RDI + 0x268) = 0;
          *(undefined4 *)(in_RDI + 0x26c) = 0;
          *(undefined4 *)(in_RDI + 0x270) = 0;
          *(undefined4 *)(in_RDI + 0x274) = 0;
          *(undefined4 *)(in_RDI + 0x278) = 0;
          *(undefined8 *)(in_RDI + 0x280) = 0;
          *(undefined8 *)(in_RDI + 0x248) = 0;
          *ppvVar2 = *local_710;
          *(void **)(in_RDI + 0x248) = local_710[1];
          *(void **)(in_RDI + 0x250) = local_710[2];
          *(undefined4 *)(in_RDI + 600) = *(undefined4 *)(local_710 + 3);
          *(void **)(in_RDI + 0x260) = local_710[4];
          *(undefined4 *)(in_RDI + 0x268) = *(undefined4 *)(local_710 + 5);
          *(undefined4 *)(in_RDI + 0x26c) = *(undefined4 *)((long)local_710 + 0x2c);
          *(undefined4 *)(in_RDI + 0x270) = *(undefined4 *)(local_710 + 6);
          *(undefined4 *)(in_RDI + 0x274) = *(undefined4 *)((long)local_710 + 0x34);
          *(undefined4 *)(in_RDI + 0x278) = *(undefined4 *)(local_710 + 7);
          *(void **)(in_RDI + 0x280) = local_710[8];
        }
        local_8a8 = &local_a80;
        local_700 = ppvVar2;
        local_2a0 = local_8a8;
        if (local_a78 != (int *)0x0) {
          local_2a4 = 0xffffffff;
          LOCK();
          local_2a8 = *local_a78;
          *local_a78 = *local_a78 + -1;
          UNLOCK();
          if (local_2a8 == 1) {
            if (local_a60 == (long *)0x0) {
              local_1d8 = local_a80;
              if (local_a80 != (void *)0x0) {
                free(local_a80);
              }
            }
            else {
              (**(code **)(*local_a60 + 0x18))(local_a60,local_a80);
            }
          }
        }
        local_a80 = (void *)0x0;
        local_a70 = 0;
        local_a68 = 0;
        local_a58 = 0;
        local_a54 = 0;
        local_a50 = 0;
        local_a4c = 0;
        local_a48 = 0;
        local_a40 = 0;
        local_a78 = (int *)0x0;
        local_508 = (undefined8 *)(in_RDI + 0x240);
        local_50c = local_a34;
        local_510 = (int)*(undefined8 *)(in_RDI + 0x280) * *(int *)(in_RDI + 0x278);
        local_518 = (undefined4 *)*local_508;
        for (local_51c = 0; local_c8 = local_508, local_51c < local_510; local_51c = local_51c + 1)
        {
          *local_518 = local_a34;
          local_518 = local_518 + 1;
        }
      }
      else if ((*(int *)(in_RDI + 0x10c) == 2) || (*(int *)(in_RDI + 0x10c) == 0x66)) {
        (**(code **)(*local_900 + 0x10))(&local_ac8,local_900,1);
        ppvVar2 = (void **)(in_RDI + 0x1f8);
        local_730 = &local_ac8;
        local_728 = ppvVar2;
        if (ppvVar2 != local_730) {
          if (local_ac0 != (int *)0x0) {
            local_734 = 1;
            LOCK();
            local_738 = *local_ac0;
            *local_ac0 = *local_ac0 + 1;
            UNLOCK();
          }
          local_460 = ppvVar2;
          if (*(long *)(in_RDI + 0x200) != 0) {
            piVar1 = *(int **)(in_RDI + 0x200);
            local_464 = 0xffffffff;
            LOCK();
            local_468 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_468 == 1) {
              if (*(long *)(in_RDI + 0x218) == 0) {
                local_f8 = *ppvVar2;
                if (local_f8 != (void *)0x0) {
                  free(local_f8);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x218) + 0x18))
                          (*(long **)(in_RDI + 0x218),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x208) = 0;
          *(undefined4 *)(in_RDI + 0x210) = 0;
          *(undefined4 *)(in_RDI + 0x220) = 0;
          *(undefined4 *)(in_RDI + 0x224) = 0;
          *(undefined4 *)(in_RDI + 0x228) = 0;
          *(undefined4 *)(in_RDI + 0x22c) = 0;
          *(undefined4 *)(in_RDI + 0x230) = 0;
          *(undefined8 *)(in_RDI + 0x238) = 0;
          *(undefined8 *)(in_RDI + 0x200) = 0;
          *ppvVar2 = *local_730;
          *(void **)(in_RDI + 0x200) = local_730[1];
          *(void **)(in_RDI + 0x208) = local_730[2];
          *(undefined4 *)(in_RDI + 0x210) = *(undefined4 *)(local_730 + 3);
          *(void **)(in_RDI + 0x218) = local_730[4];
          *(undefined4 *)(in_RDI + 0x220) = *(undefined4 *)(local_730 + 5);
          *(undefined4 *)(in_RDI + 0x224) = *(undefined4 *)((long)local_730 + 0x2c);
          *(undefined4 *)(in_RDI + 0x228) = *(undefined4 *)(local_730 + 6);
          *(undefined4 *)(in_RDI + 0x22c) = *(undefined4 *)((long)local_730 + 0x34);
          *(undefined4 *)(in_RDI + 0x230) = *(undefined4 *)(local_730 + 7);
          *(void **)(in_RDI + 0x238) = local_730[8];
        }
        local_898 = &local_ac8;
        local_720 = ppvVar2;
        local_2c0 = local_898;
        if (local_ac0 != (int *)0x0) {
          local_2c4 = 0xffffffff;
          LOCK();
          local_2c8 = *local_ac0;
          *local_ac0 = *local_ac0 + -1;
          UNLOCK();
          if (local_2c8 == 1) {
            if (local_aa8 == (long *)0x0) {
              if (local_ac8 != (void *)0x0) {
                free(local_ac8);
              }
            }
            else {
              (**(code **)(*local_aa8 + 0x18))(local_aa8,local_ac8);
            }
          }
        }
        local_ac8 = (void *)0x0;
        local_ab8 = 0;
        local_ab0 = 0;
        local_aa0 = 0;
        local_a9c = 0;
        local_a98 = 0;
        local_a94 = 0;
        local_a90 = 0;
        local_a88 = 0;
        local_ac0 = (int *)0x0;
        (**(code **)(*local_900 + 0x10))(&local_b10,local_900,1);
        ppvVar2 = (void **)(in_RDI + 0x240);
        local_750 = &local_b10;
        local_748 = ppvVar2;
        if (ppvVar2 != local_750) {
          if (local_b08 != (int *)0x0) {
            local_754 = 1;
            LOCK();
            local_758 = *local_b08;
            *local_b08 = *local_b08 + 1;
            UNLOCK();
          }
          local_450 = ppvVar2;
          if (*(long *)(in_RDI + 0x248) != 0) {
            piVar1 = *(int **)(in_RDI + 0x248);
            local_454 = 0xffffffff;
            LOCK();
            local_458 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_458 == 1) {
              if (*(long *)(in_RDI + 0x260) == 0) {
                local_100 = *ppvVar2;
                if (local_100 != (void *)0x0) {
                  free(local_100);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x260) + 0x18))
                          (*(long **)(in_RDI + 0x260),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x250) = 0;
          *(undefined4 *)(in_RDI + 600) = 0;
          *(undefined4 *)(in_RDI + 0x268) = 0;
          *(undefined4 *)(in_RDI + 0x26c) = 0;
          *(undefined4 *)(in_RDI + 0x270) = 0;
          *(undefined4 *)(in_RDI + 0x274) = 0;
          *(undefined4 *)(in_RDI + 0x278) = 0;
          *(undefined8 *)(in_RDI + 0x280) = 0;
          *(undefined8 *)(in_RDI + 0x248) = 0;
          *ppvVar2 = *local_750;
          *(void **)(in_RDI + 0x248) = local_750[1];
          *(void **)(in_RDI + 0x250) = local_750[2];
          *(undefined4 *)(in_RDI + 600) = *(undefined4 *)(local_750 + 3);
          *(void **)(in_RDI + 0x260) = local_750[4];
          *(undefined4 *)(in_RDI + 0x268) = *(undefined4 *)(local_750 + 5);
          *(undefined4 *)(in_RDI + 0x26c) = *(undefined4 *)((long)local_750 + 0x2c);
          *(undefined4 *)(in_RDI + 0x270) = *(undefined4 *)(local_750 + 6);
          *(undefined4 *)(in_RDI + 0x274) = *(undefined4 *)((long)local_750 + 0x34);
          *(undefined4 *)(in_RDI + 0x278) = *(undefined4 *)(local_750 + 7);
          *(void **)(in_RDI + 0x280) = local_750[8];
        }
        local_888 = &local_b10;
        local_740 = ppvVar2;
        local_2e0 = local_888;
        if (local_b08 != (int *)0x0) {
          local_2e4 = 0xffffffff;
          LOCK();
          local_2e8 = *local_b08;
          *local_b08 = *local_b08 + -1;
          UNLOCK();
          if (local_2e8 == 1) {
            if (local_af0 == (long *)0x0) {
              if (local_b10 != (void *)0x0) {
                free(local_b10);
              }
            }
            else {
              (**(code **)(*local_af0 + 0x18))(local_af0,local_b10);
            }
          }
        }
        local_b10 = (void *)0x0;
        local_b00 = 0;
        local_af8 = 0;
        local_ae8 = 0;
        local_ae4 = 0;
        local_ae0 = 0;
        local_adc = 0;
        local_ad8 = 0;
        local_ad0 = 0;
        local_b08 = (int *)0x0;
        local_638 = (undefined8 *)(in_RDI + 0x1f8);
        local_640 = 0;
        local_b14 = *(undefined4 *)*local_638;
        local_5ec = *(undefined4 *)(in_RDI + 0x108);
        in_stack_fffffffffffff138 = &local_b60;
        local_5f8 = 4;
        local_600 = 0;
        local_b60.data = (void *)0x0;
        local_b60.refcount = (int *)0x0;
        local_b60.elemsize = 0;
        local_b60.elempack = 0;
        local_b60.allocator = (Allocator *)0x0;
        local_b60.dims = 0;
        local_b60.w = 0;
        local_b60.h = 0;
        local_b60.d = 0;
        local_b60.c = 0;
        local_b60.cstep = 0;
        local_5e8 = in_stack_fffffffffffff138;
        Mat::create(in_stack_fffffffffffff040,in_stack_fffffffffffff03c,in_stack_fffffffffffff030,
                    in_stack_fffffffffffff028);
        in_stack_fffffffffffff140 = (Mat *)(in_RDI + 0x1f8);
        local_770 = &local_b60;
        local_768 = in_stack_fffffffffffff140;
        if (in_stack_fffffffffffff140 != local_770) {
          if (local_b60.refcount != (int *)0x0) {
            local_774 = 1;
            LOCK();
            local_778 = *local_b60.refcount;
            *local_b60.refcount = *local_b60.refcount + 1;
            UNLOCK();
          }
          pMVar5 = in_stack_fffffffffffff140;
          local_440 = in_stack_fffffffffffff140;
          if (*(long *)(in_RDI + 0x200) != 0) {
            piVar1 = *(int **)(in_RDI + 0x200);
            local_444 = 0xffffffff;
            LOCK();
            local_448 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_448 == 1) {
              if (*(long *)(in_RDI + 0x218) == 0) {
                local_108 = in_stack_fffffffffffff140->data;
                if (local_108 != (void *)0x0) {
                  free(local_108);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x218) + 0x18))
                          (*(long **)(in_RDI + 0x218),in_stack_fffffffffffff140->data);
              }
            }
          }
          in_stack_fffffffffffff140->data = (void *)0x0;
          in_stack_fffffffffffff140->elemsize = 0;
          in_stack_fffffffffffff140->elempack = 0;
          in_stack_fffffffffffff140->dims = 0;
          in_stack_fffffffffffff140->w = 0;
          in_stack_fffffffffffff140->h = 0;
          in_stack_fffffffffffff140->d = 0;
          in_stack_fffffffffffff140->c = 0;
          in_stack_fffffffffffff140->cstep = 0;
          in_stack_fffffffffffff140->refcount = (int *)0x0;
          pMVar5->data = local_770->data;
          pMVar5->refcount = local_770->refcount;
          pMVar5->elemsize = local_770->elemsize;
          pMVar5->elempack = local_770->elempack;
          pMVar5->allocator = local_770->allocator;
          pMVar5->dims = local_770->dims;
          pMVar5->w = local_770->w;
          pMVar5->h = local_770->h;
          pMVar5->d = local_770->d;
          pMVar5->c = local_770->c;
          pMVar5->cstep = local_770->cstep;
          in_stack_fffffffffffff130 = in_stack_fffffffffffff140;
          in_stack_fffffffffffff140 = pMVar5;
        }
        in_stack_fffffffffffff128 = &local_b60;
        local_878 = in_stack_fffffffffffff128;
        local_760 = in_stack_fffffffffffff140;
        local_300 = in_stack_fffffffffffff128;
        if (local_b60.refcount != (int *)0x0) {
          local_304 = 0xffffffff;
          LOCK();
          local_308 = *local_b60.refcount;
          *local_b60.refcount = *local_b60.refcount + -1;
          UNLOCK();
          if (local_308 == 1) {
            if (local_b60.allocator == (Allocator *)0x0) {
              local_1a8 = local_b60.data;
              if (local_b60.data != (void *)0x0) {
                free(local_b60.data);
              }
            }
            else {
              (*(local_b60.allocator)->_vptr_Allocator[3])(local_b60.allocator,local_b60.data);
            }
          }
        }
        in_stack_fffffffffffff128->data = (void *)0x0;
        in_stack_fffffffffffff128->elemsize = 0;
        in_stack_fffffffffffff128->elempack = 0;
        in_stack_fffffffffffff128->dims = 0;
        in_stack_fffffffffffff128->w = 0;
        in_stack_fffffffffffff128->h = 0;
        in_stack_fffffffffffff128->d = 0;
        in_stack_fffffffffffff128->c = 0;
        in_stack_fffffffffffff128->cstep = 0;
        in_stack_fffffffffffff128->refcount = (int *)0x0;
        local_528 = (undefined8 *)(in_RDI + 0x1f8);
        local_52c = local_b14;
        local_530 = (int)*(undefined8 *)(in_RDI + 0x238) * *(int *)(in_RDI + 0x230);
        local_538 = (undefined4 *)*local_528;
        for (local_53c = 0; local_53c < local_530; local_53c = local_53c + 1) {
          *local_538 = local_b14;
          local_538 = local_538 + 1;
        }
        local_648 = (undefined8 *)(in_RDI + 0x240);
        local_650 = 0;
        local_b64 = *(undefined4 *)*local_648;
        local_5cc = *(undefined4 *)(in_RDI + 0x108);
        local_5c8 = &local_bb0;
        local_5d8 = 4;
        local_5e0 = 0;
        local_bb0 = (void *)0x0;
        local_ba8 = (int *)0x0;
        local_ba0 = 0;
        local_b98 = 0;
        local_b90 = (long *)0x0;
        local_b88 = 0;
        local_b84 = 0;
        local_b80 = 0;
        local_b7c = 0;
        local_b78 = 0;
        local_b70 = 0;
        local_c0 = local_528;
        Mat::create(in_stack_fffffffffffff040,in_stack_fffffffffffff03c,in_stack_fffffffffffff030,
                    in_stack_fffffffffffff028);
        ppvVar2 = (void **)(in_RDI + 0x240);
        local_790 = &local_bb0;
        local_788 = ppvVar2;
        if (ppvVar2 != local_790) {
          if (local_ba8 != (int *)0x0) {
            local_794 = 1;
            LOCK();
            local_798 = *local_ba8;
            *local_ba8 = *local_ba8 + 1;
            UNLOCK();
          }
          local_430 = ppvVar2;
          if (*(long *)(in_RDI + 0x248) != 0) {
            piVar1 = *(int **)(in_RDI + 0x248);
            local_434 = 0xffffffff;
            LOCK();
            local_438 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_438 == 1) {
              if (*(long *)(in_RDI + 0x260) == 0) {
                local_110 = *ppvVar2;
                if (local_110 != (void *)0x0) {
                  free(local_110);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x260) + 0x18))
                          (*(long **)(in_RDI + 0x260),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x250) = 0;
          *(undefined4 *)(in_RDI + 600) = 0;
          *(undefined4 *)(in_RDI + 0x268) = 0;
          *(undefined4 *)(in_RDI + 0x26c) = 0;
          *(undefined4 *)(in_RDI + 0x270) = 0;
          *(undefined4 *)(in_RDI + 0x274) = 0;
          *(undefined4 *)(in_RDI + 0x278) = 0;
          *(undefined8 *)(in_RDI + 0x280) = 0;
          *(undefined8 *)(in_RDI + 0x248) = 0;
          *ppvVar2 = *local_790;
          *(void **)(in_RDI + 0x248) = local_790[1];
          *(void **)(in_RDI + 0x250) = local_790[2];
          *(undefined4 *)(in_RDI + 600) = *(undefined4 *)(local_790 + 3);
          *(void **)(in_RDI + 0x260) = local_790[4];
          *(undefined4 *)(in_RDI + 0x268) = *(undefined4 *)(local_790 + 5);
          *(undefined4 *)(in_RDI + 0x26c) = *(undefined4 *)((long)local_790 + 0x2c);
          *(undefined4 *)(in_RDI + 0x270) = *(undefined4 *)(local_790 + 6);
          *(undefined4 *)(in_RDI + 0x274) = *(undefined4 *)((long)local_790 + 0x34);
          *(undefined4 *)(in_RDI + 0x278) = *(undefined4 *)(local_790 + 7);
          *(void **)(in_RDI + 0x280) = local_790[8];
        }
        local_868 = &local_bb0;
        local_780 = ppvVar2;
        local_320 = local_868;
        if (local_ba8 != (int *)0x0) {
          local_324 = 0xffffffff;
          LOCK();
          local_328 = *local_ba8;
          *local_ba8 = *local_ba8 + -1;
          UNLOCK();
          if (local_328 == 1) {
            if (local_b90 == (long *)0x0) {
              local_198 = local_bb0;
              if (local_bb0 != (void *)0x0) {
                free(local_bb0);
              }
            }
            else {
              (**(code **)(*local_b90 + 0x18))(local_b90,local_bb0);
            }
          }
        }
        local_bb0 = (void *)0x0;
        local_ba0 = 0;
        local_b98 = 0;
        local_b88 = 0;
        local_b84 = 0;
        local_b80 = 0;
        local_b7c = 0;
        local_b78 = 0;
        local_b70 = 0;
        local_ba8 = (int *)0x0;
        local_548 = (undefined8 *)(in_RDI + 0x240);
        local_54c = local_b64;
        local_550 = (int)*(undefined8 *)(in_RDI + 0x280) * *(int *)(in_RDI + 0x278);
        local_558 = (undefined4 *)*local_548;
        for (local_55c = 0; local_b8 = local_548, local_55c < local_550; local_55c = local_55c + 1)
        {
          *local_558 = local_b64;
          local_558 = local_558 + 1;
        }
      }
      if (100 < *(int *)(in_RDI + 0x10c)) {
        (**(code **)(*local_900 + 0x10))(&local_bf8,local_900,1);
        ppvVar2 = (void **)(in_RDI + 0x288);
        local_7b0 = &local_bf8;
        local_7a8 = ppvVar2;
        if (ppvVar2 != local_7b0) {
          if (local_bf0 != (int *)0x0) {
            local_7b4 = 1;
            LOCK();
            local_7b8 = *local_bf0;
            *local_bf0 = *local_bf0 + 1;
            UNLOCK();
          }
          local_420 = ppvVar2;
          if (*(long *)(in_RDI + 0x290) != 0) {
            piVar1 = *(int **)(in_RDI + 0x290);
            local_424 = 0xffffffff;
            LOCK();
            local_428 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_428 == 1) {
              if (*(long *)(in_RDI + 0x2a8) == 0) {
                local_118 = *ppvVar2;
                if (local_118 != (void *)0x0) {
                  free(local_118);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x2a8) + 0x18))
                          (*(long **)(in_RDI + 0x2a8),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x298) = 0;
          *(undefined4 *)(in_RDI + 0x2a0) = 0;
          *(undefined4 *)(in_RDI + 0x2b0) = 0;
          *(undefined4 *)(in_RDI + 0x2b4) = 0;
          *(undefined4 *)(in_RDI + 0x2b8) = 0;
          *(undefined4 *)(in_RDI + 700) = 0;
          *(undefined4 *)(in_RDI + 0x2c0) = 0;
          *(undefined8 *)(in_RDI + 0x2c8) = 0;
          *(undefined8 *)(in_RDI + 0x290) = 0;
          *ppvVar2 = *local_7b0;
          *(void **)(in_RDI + 0x290) = local_7b0[1];
          *(void **)(in_RDI + 0x298) = local_7b0[2];
          *(undefined4 *)(in_RDI + 0x2a0) = *(undefined4 *)(local_7b0 + 3);
          *(void **)(in_RDI + 0x2a8) = local_7b0[4];
          *(undefined4 *)(in_RDI + 0x2b0) = *(undefined4 *)(local_7b0 + 5);
          *(undefined4 *)(in_RDI + 0x2b4) = *(undefined4 *)((long)local_7b0 + 0x2c);
          *(undefined4 *)(in_RDI + 0x2b8) = *(undefined4 *)(local_7b0 + 6);
          *(undefined4 *)(in_RDI + 700) = *(undefined4 *)((long)local_7b0 + 0x34);
          *(undefined4 *)(in_RDI + 0x2c0) = *(undefined4 *)(local_7b0 + 7);
          *(void **)(in_RDI + 0x2c8) = local_7b0[8];
        }
        local_858 = &local_bf8;
        local_7a0 = ppvVar2;
        local_340 = local_858;
        if (local_bf0 != (int *)0x0) {
          local_344 = 0xffffffff;
          LOCK();
          local_348 = *local_bf0;
          *local_bf0 = *local_bf0 + -1;
          UNLOCK();
          if (local_348 == 1) {
            if (local_bd8 == (long *)0x0) {
              if (local_bf8 != (void *)0x0) {
                free(local_bf8);
              }
            }
            else {
              (**(code **)(*local_bd8 + 0x18))(local_bd8,local_bf8);
            }
          }
        }
        local_bf8 = (void *)0x0;
        local_be8 = 0;
        local_be0 = 0;
        local_bd0 = 0;
        local_bcc = 0;
        local_bc8 = 0;
        local_bc4 = 0;
        local_bc0 = 0;
        local_bb8 = 0;
        local_bf0 = (int *)0x0;
        local_658 = (undefined8 *)(in_RDI + 0x288);
        local_660 = 0;
        local_bfc = *(undefined4 *)*local_658;
        local_5ac = *(undefined4 *)(in_RDI + 0x108);
        local_5a8 = &local_c48;
        local_5b8 = 4;
        local_5c0 = 0;
        local_c48 = (void *)0x0;
        local_c40 = (int *)0x0;
        local_c38 = 0;
        local_c30 = 0;
        local_c28 = (long *)0x0;
        local_c20 = 0;
        local_c1c = 0;
        local_c18 = 0;
        local_c14 = 0;
        local_c10 = 0;
        local_c08 = 0;
        Mat::create(in_stack_fffffffffffff040,in_stack_fffffffffffff03c,in_stack_fffffffffffff030,
                    in_stack_fffffffffffff028);
        ppvVar2 = (void **)(in_RDI + 0x288);
        local_7d0 = &local_c48;
        local_7c8 = ppvVar2;
        if (ppvVar2 != local_7d0) {
          if (local_c40 != (int *)0x0) {
            local_7d4 = 1;
            LOCK();
            local_7d8 = *local_c40;
            *local_c40 = *local_c40 + 1;
            UNLOCK();
          }
          local_410 = ppvVar2;
          if (*(long *)(in_RDI + 0x290) != 0) {
            piVar1 = *(int **)(in_RDI + 0x290);
            local_414 = 0xffffffff;
            LOCK();
            local_418 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_418 == 1) {
              if (*(long *)(in_RDI + 0x2a8) == 0) {
                local_120 = *ppvVar2;
                if (local_120 != (void *)0x0) {
                  free(local_120);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x2a8) + 0x18))
                          (*(long **)(in_RDI + 0x2a8),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x298) = 0;
          *(undefined4 *)(in_RDI + 0x2a0) = 0;
          *(undefined4 *)(in_RDI + 0x2b0) = 0;
          *(undefined4 *)(in_RDI + 0x2b4) = 0;
          *(undefined4 *)(in_RDI + 0x2b8) = 0;
          *(undefined4 *)(in_RDI + 700) = 0;
          *(undefined4 *)(in_RDI + 0x2c0) = 0;
          *(undefined8 *)(in_RDI + 0x2c8) = 0;
          *(undefined8 *)(in_RDI + 0x290) = 0;
          *ppvVar2 = *local_7d0;
          *(void **)(in_RDI + 0x290) = local_7d0[1];
          *(void **)(in_RDI + 0x298) = local_7d0[2];
          *(undefined4 *)(in_RDI + 0x2a0) = *(undefined4 *)(local_7d0 + 3);
          *(void **)(in_RDI + 0x2a8) = local_7d0[4];
          *(undefined4 *)(in_RDI + 0x2b0) = *(undefined4 *)(local_7d0 + 5);
          *(undefined4 *)(in_RDI + 0x2b4) = *(undefined4 *)((long)local_7d0 + 0x2c);
          *(undefined4 *)(in_RDI + 0x2b8) = *(undefined4 *)(local_7d0 + 6);
          *(undefined4 *)(in_RDI + 700) = *(undefined4 *)((long)local_7d0 + 0x34);
          *(undefined4 *)(in_RDI + 0x2c0) = *(undefined4 *)(local_7d0 + 7);
          *(void **)(in_RDI + 0x2c8) = local_7d0[8];
        }
        local_848 = &local_c48;
        local_7c0 = ppvVar2;
        local_360 = local_848;
        if (local_c40 != (int *)0x0) {
          local_364 = 0xffffffff;
          LOCK();
          local_368 = *local_c40;
          *local_c40 = *local_c40 + -1;
          UNLOCK();
          if (local_368 == 1) {
            if (local_c28 == (long *)0x0) {
              local_178 = local_c48;
              if (local_c48 != (void *)0x0) {
                free(local_c48);
              }
            }
            else {
              (**(code **)(*local_c28 + 0x18))(local_c28,local_c48);
            }
          }
        }
        local_c48 = (void *)0x0;
        local_c38 = 0;
        local_c30 = 0;
        local_c20 = 0;
        local_c1c = 0;
        local_c18 = 0;
        local_c14 = 0;
        local_c10 = 0;
        local_c08 = 0;
        local_c40 = (int *)0x0;
        local_568 = (undefined8 *)(in_RDI + 0x288);
        local_56c = local_bfc;
        local_570 = (int)*(undefined8 *)(in_RDI + 0x2c8) * *(int *)(in_RDI + 0x2c0);
        local_578 = (undefined4 *)*local_568;
        for (local_57c = 0; local_b0 = local_568, local_57c < local_570; local_57c = local_57c + 1)
        {
          *local_578 = local_bfc;
          local_578 = local_578 + 1;
        }
      }
      if ((*(long *)(in_RDI + 0x178) == 4) && (*(int *)(in_RDI + 0x10c) != 0)) {
        local_58c = *(undefined4 *)(in_RDI + 0x104);
        local_588 = &local_c90;
        local_598 = 1;
        local_5a0 = 0;
        local_c90 = (void *)0x0;
        local_c88 = (int *)0x0;
        local_c80 = 0;
        local_c78 = 0;
        local_c70 = (long *)0x0;
        local_c68 = 0;
        local_c64 = 0;
        local_c60 = 0;
        local_c5c = 0;
        local_c58 = 0;
        local_c50 = 0;
        Mat::create(in_stack_fffffffffffff040,in_stack_fffffffffffff03c,in_stack_fffffffffffff030,
                    in_stack_fffffffffffff028);
        local_678 = &local_c90;
        if (local_c90 != (void *)0x0) {
          local_98 = local_678;
        }
        local_f61 = local_c90 != (void *)0x0 && local_c50 * local_c58 != 0;
        if (local_f61) {
          local_c98 = *(int *)(in_RDI + 0x104) / *(int *)(in_RDI + 0x108);
          for (local_c9c = 0; local_c9c < *(int *)(in_RDI + 0x108); local_c9c = local_c9c + 1) {
            Option::Option(in_stack_fffffffffffff020);
            local_cdc = 1;
            local_cd8 = local_c70;
            local_cb9 = 0;
            local_4c8 = (long *)(in_RDI + 0x168);
            local_4cc = local_c98 * local_c9c;
            local_4c0 = &local_d28;
            local_4d0 = local_c98;
            local_78 = (void *)(*local_4c8 + (long)local_4cc * *(long *)(in_RDI + 0x178));
            local_80 = *(undefined8 *)(in_RDI + 0x178);
            local_84 = *(undefined4 *)(in_RDI + 0x180);
            local_90 = *(long **)(in_RDI + 0x188);
            local_68 = &local_d28;
            local_6c = local_c98;
            local_d20 = (int *)0x0;
            local_d00 = 1;
            local_cfc = local_c98;
            local_cf8 = 1;
            local_cf4 = 1;
            local_cf0 = 1;
            local_ce8 = (long)local_c98;
            local_4e4 = local_c98 * local_c9c;
            local_4d8 = &local_d70;
            local_4e0 = &local_c90;
            local_4e8 = local_c98;
            local_48 = (void *)((long)local_c90 + local_4e4 * local_c80);
            local_50 = local_c80;
            local_54 = local_c78;
            local_38 = &local_d70;
            local_3c = local_c98;
            local_d68 = (int *)0x0;
            local_d60 = local_c80;
            local_d58 = local_c78;
            local_d50 = local_c70;
            local_d48 = 1;
            local_d44 = local_c98;
            local_d40 = 1;
            local_d3c = 1;
            local_d38 = 1;
            local_d30 = (long)local_c98;
            local_4f8 = (long *)(in_RDI + 0x1f8);
            local_4f0 = &local_db8;
            local_4fc = local_c9c;
            local_500 = 1;
            local_18 = (void *)(*local_4f8 + (long)local_c9c * *(long *)(in_RDI + 0x208));
            local_20 = *(undefined8 *)(in_RDI + 0x208);
            local_24 = *(undefined4 *)(in_RDI + 0x210);
            local_30 = *(long **)(in_RDI + 0x218);
            local_8 = &local_db8;
            local_c = 1;
            local_db0 = (int *)0x0;
            local_d90 = 1;
            local_d8c = 1;
            local_d88 = 1;
            local_d84 = 1;
            local_d80 = 1;
            local_d78 = 1;
            local_db8 = local_18;
            local_da8 = local_20;
            local_da0 = local_24;
            local_d98 = local_30;
            local_d70 = local_48;
            local_d28 = local_78;
            local_d18 = local_80;
            local_d10 = local_84;
            local_d08 = local_90;
            quantize_to_int8(in_stack_fffffffffffff140,in_stack_fffffffffffff138,
                             in_stack_fffffffffffff130,(Option *)in_stack_fffffffffffff128);
            local_838 = &local_db8;
            local_380 = local_838;
            if (local_db0 != (int *)0x0) {
              local_384 = 0xffffffff;
              LOCK();
              local_388 = *local_db0;
              *local_db0 = *local_db0 + -1;
              UNLOCK();
              if (local_388 == 1) {
                if (local_d98 == (long *)0x0) {
                  local_168 = local_db8;
                  if (local_db8 != (void *)0x0) {
                    free(local_db8);
                  }
                }
                else {
                  (**(code **)(*local_d98 + 0x18))(local_d98,local_db8);
                }
              }
            }
            local_db8 = (void *)0x0;
            local_da8 = 0;
            local_da0 = 0;
            local_d90 = 0;
            local_d8c = 0;
            local_d88 = 0;
            local_d84 = 0;
            local_d80 = 0;
            local_d78 = 0;
            local_db0 = (int *)0x0;
            local_828 = &local_d70;
            local_3a0 = local_828;
            if (local_d68 != (int *)0x0) {
              local_3a4 = 0xffffffff;
              LOCK();
              local_3a8 = *local_d68;
              *local_d68 = *local_d68 + -1;
              UNLOCK();
              if (local_3a8 == 1) {
                if (local_d50 == (long *)0x0) {
                  local_158 = local_d70;
                  if (local_d70 != (void *)0x0) {
                    free(local_d70);
                  }
                }
                else {
                  (**(code **)(*local_d50 + 0x18))(local_d50,local_d70);
                }
              }
            }
            local_d70 = (void *)0x0;
            local_d60 = 0;
            local_d58 = 0;
            local_d48 = 0;
            local_d44 = 0;
            local_d40 = 0;
            local_d3c = 0;
            local_d38 = 0;
            local_d30 = 0;
            local_d68 = (int *)0x0;
            local_818 = &local_d28;
            local_3c0 = local_818;
            if (local_d20 != (int *)0x0) {
              local_3c4 = 0xffffffff;
              LOCK();
              local_3c8 = *local_d20;
              *local_d20 = *local_d20 + -1;
              UNLOCK();
              if (local_3c8 == 1) {
                if (local_d08 == (long *)0x0) {
                  local_148 = local_d28;
                  if (local_d28 != (void *)0x0) {
                    free(local_d28);
                  }
                }
                else {
                  (**(code **)(*local_d08 + 0x18))(local_d08,local_d28);
                }
              }
            }
            local_d28 = (void *)0x0;
            local_d18 = 0;
            local_d10 = 0;
            local_d00 = 0;
            local_cfc = 0;
            local_cf8 = 0;
            local_cf4 = 0;
            local_cf0 = 0;
            local_ce8 = 0;
            local_d20 = (int *)0x0;
          }
          ppvVar2 = (void **)(in_RDI + 0x168);
          local_7f0 = &local_c90;
          local_7e8 = ppvVar2;
          if (ppvVar2 != local_7f0) {
            if (local_c88 != (int *)0x0) {
              local_7f4 = 1;
              LOCK();
              local_7f8 = *local_c88;
              *local_c88 = *local_c88 + 1;
              UNLOCK();
            }
            ppvVar4 = ppvVar2;
            local_400 = ppvVar2;
            if (*(long *)(in_RDI + 0x170) != 0) {
              piVar1 = *(int **)(in_RDI + 0x170);
              local_404 = 0xffffffff;
              LOCK();
              local_408 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_408 == 1) {
                if (*(long *)(in_RDI + 0x188) == 0) {
                  local_128 = *ppvVar2;
                  if (local_128 != (void *)0x0) {
                    free(local_128);
                  }
                }
                else {
                  (**(code **)(**(long **)(in_RDI + 0x188) + 0x18))
                            (*(long **)(in_RDI + 0x188),*ppvVar2);
                }
              }
            }
            *ppvVar2 = (void *)0x0;
            ppvVar2[2] = (void *)0x0;
            *(undefined4 *)(ppvVar2 + 3) = 0;
            *(undefined4 *)(ppvVar2 + 5) = 0;
            *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
            *(undefined4 *)(ppvVar2 + 6) = 0;
            *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
            *(undefined4 *)(ppvVar2 + 7) = 0;
            ppvVar2[8] = (void *)0x0;
            ppvVar2[1] = (void *)0x0;
            *ppvVar4 = *local_7f0;
            ppvVar4[1] = local_7f0[1];
            ppvVar4[2] = local_7f0[2];
            *(undefined4 *)(ppvVar4 + 3) = *(undefined4 *)(local_7f0 + 3);
            ppvVar4[4] = local_7f0[4];
            *(undefined4 *)(ppvVar4 + 5) = *(undefined4 *)(local_7f0 + 5);
            *(undefined4 *)((long)ppvVar4 + 0x2c) = *(undefined4 *)((long)local_7f0 + 0x2c);
            *(undefined4 *)(ppvVar4 + 6) = *(undefined4 *)(local_7f0 + 6);
            *(undefined4 *)((long)ppvVar4 + 0x34) = *(undefined4 *)((long)local_7f0 + 0x34);
            *(undefined4 *)(ppvVar4 + 7) = *(undefined4 *)(local_7f0 + 7);
            ppvVar4[8] = local_7f0[8];
            ppvVar2 = ppvVar4;
          }
          local_c94 = 0;
          local_7e0 = ppvVar2;
        }
        else {
          local_8ec = -100;
          local_c94 = 1;
        }
        ppvVar2 = &local_c90;
        if (local_c88 != (int *)0x0) {
          local_3e4 = 0xffffffff;
          LOCK();
          local_3e8 = *local_c88;
          *local_c88 = *local_c88 + -1;
          UNLOCK();
          if (local_3e8 == 1) {
            local_808 = ppvVar2;
            local_3e0 = ppvVar2;
            if (local_c70 == (long *)0x0) {
              local_138 = local_c90;
              if (local_c90 != (void *)0x0) {
                free(local_c90);
              }
            }
            else {
              (**(code **)(*local_c70 + 0x18))(local_c70,local_c90);
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        ppvVar2[2] = (void *)0x0;
        *(undefined4 *)(ppvVar2 + 3) = 0;
        *(undefined4 *)(ppvVar2 + 5) = 0;
        *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
        *(undefined4 *)(ppvVar2 + 6) = 0;
        *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
        *(undefined4 *)(ppvVar2 + 7) = 0;
        ppvVar2[8] = (void *)0x0;
        ppvVar2[1] = (void *)0x0;
        if (local_c94 != 0) {
          return local_8ec;
        }
      }
      local_8ec = 0;
    }
  }
  else {
    local_8ec = 0;
  }
  return local_8ec;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    if (dynamic_weight)
        return 0;

    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term == 1 || int8_scale_term == 101)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }
    else if (int8_scale_term == 2 || int8_scale_term == 102)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    if (int8_scale_term > 100)
    {
        top_blob_int8_scales = mb.load(1, 1);

        float top_blob_int8_scale = top_blob_int8_scales[0];
        top_blob_int8_scales = Mat(group);
        top_blob_int8_scales.fill(top_blob_int8_scale);
    }
#endif // NCNN_INT8

#if NCNN_INT8
    // runtime quantize the weight data
    if (weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g = 0; g < group; g++)
        {
            Option opt_q;
            opt_q.num_threads = 1;
            opt_q.blob_allocator = int8_weight_data.allocator;
            opt_q.use_packing_layout = false;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            const Mat weight_data_int8_scales_g = weight_data_int8_scales.range(g, 1);
            quantize_to_int8(weight_data_g, int8_weight_data_g, weight_data_int8_scales_g, opt_q);
        }

        weight_data = int8_weight_data;
    }
#endif // NCNN_INT8

    return 0;
}